

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlParser.cpp
# Opt level: O1

XMLNode __thiscall
XMLParser::XMLNode::parseString(XMLNode *this,char *lpszXML,char *tag,XMLResults *pResults)

{
  char cVar1;
  undefined *puVar2;
  int iVar3;
  XMLError XVar4;
  XMLNode *A;
  int iVar5;
  char *__s1;
  XMLNode xnode;
  XML xml;
  XMLNode local_80;
  XMLNode local_78;
  char *local_70;
  char *local_68;
  undefined8 local_60;
  XMLError local_58;
  undefined8 local_50;
  undefined4 local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  if (lpszXML == (char *)0x0) {
    if (pResults != (XMLResults *)0x0) {
      pResults->error = eXMLErrorNoElements;
      pResults->nLine = 0;
      pResults->nColumn = 0;
    }
    XMLNode(this,(XMLNode *)&emptyXMLNode);
    return (XMLNode)(XMLNodeData *)this;
  }
  XMLNode(&local_80,(XMLNodeData *)0x0,(char *)0x0,'\0');
  local_60 = 0;
  local_58 = eXMLErrorNone;
  local_50 = 0;
  local_48 = 0;
  local_40 = 0;
  local_38 = 0x100000000;
  local_70 = lpszXML;
  local_68 = lpszXML;
  ParseXMLElement(&local_80,&local_70);
  if (local_80.d == (XMLNodeData *)0x0) {
    XVar4 = eXMLErrorNoXMLTagFound;
  }
  else {
    XVar4 = eXMLErrorNoXMLTagFound;
    if ((local_80.d)->nChild != 0) {
      XVar4 = local_58;
    }
  }
  if ((((local_80.d != (XMLNodeData *)0x0) && (local_80.d != (XMLNodeData *)0x0)) &&
      ((local_80.d)->nChild == 1)) &&
     ((local_80.d)->nChild + (local_80.d)->nAttribute + (local_80.d)->nText + (local_80.d)->nClear
      == 1)) {
    A = (XMLNode *)&emptyXMLNode;
    if ((local_80.d != (XMLNodeData *)0x0) && (0 < (local_80.d)->nChild)) {
      A = (local_80.d)->pChild;
    }
    XMLNode(&local_78,A);
    operator=(&local_80,&local_78);
    ~XMLNode(&local_78);
  }
  if (XVar4 < eXMLErrorEmpty) {
    if (local_80.d == (XMLNodeData *)0x0) {
      __s1 = (char *)0x0;
    }
    else {
      __s1 = (local_80.d)->lpszName;
    }
    if (((tag != (char *)0x0) && (*tag != '\0')) &&
       ((__s1 == (char *)0x0 || (iVar3 = strcasecmp(__s1,tag), iVar3 != 0)))) {
      getChildNode(&local_78,(char *)&local_80,(int *)tag);
      operator=(&local_80,&local_78);
      ~XMLNode(&local_78);
      if (local_80.d == (XMLNodeData *)0x0) {
        if (pResults != (XMLResults *)0x0) {
          pResults->error = eXMLErrorFirstTagNotFound;
          pResults->nLine = 0;
          pResults->nColumn = 0;
        }
        XMLNode(this,(XMLNode *)&emptyXMLNode);
        goto LAB_0019a0f7;
      }
    }
  }
  else {
    operator=(&local_80,(XMLNode *)&emptyXMLNode);
  }
  if ((pResults != (XMLResults *)0x0) && (pResults->error = XVar4, XVar4 != eXMLErrorNone)) {
    if (XVar4 == eXMLErrorMissingEndTag) {
      local_60 = CONCAT44(local_60._4_4_,local_60._4_4_);
    }
    if (local_70 == (char *)0x0) {
      __assert_fail("lpXML",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/build_O1/_deps/xmlparser-src/src/xmlParser.cpp"
                    ,0x997,"void XMLParser::CountLinesAndColumns(const char *, int, XMLResults *)");
    }
    pResults->nLine = 1;
    puVar2 = XML_ByteTable;
    pResults->nColumn = 1;
    if (0 < (int)local_60) {
      iVar3 = 0;
      iVar5 = 1;
      do {
        cVar1 = puVar2[(byte)local_70[iVar3]];
        if ((ulong)(byte)local_70[iVar3] == 10) {
          pResults->nLine = pResults->nLine + 1;
          iVar5 = 1;
        }
        else {
          iVar5 = iVar5 + 1;
        }
        iVar3 = iVar3 + cVar1;
        pResults->nColumn = iVar5;
      } while (iVar3 < (int)local_60);
    }
  }
  XMLNode(this,&local_80);
LAB_0019a0f7:
  ~XMLNode(&local_80);
  return (XMLNode)(XMLNodeData *)this;
}

Assistant:

XMLNode XMLNode::parseString(XMLCSTR lpszXML, XMLCSTR tag, XMLResults * pResults)
    {
        if(!lpszXML)
        {
            if(pResults)
            {
                pResults->error = eXMLErrorNoElements;
                pResults->nLine = 0;
                pResults->nColumn = 0;
            }
            return emptyXMLNode;
        }

        XMLNode xnode(NULL, NULL, FALSE);
        struct XML xml = {lpszXML, lpszXML, 0, 0, eXMLErrorNone, NULL, 0, NULL, 0, TRUE};

        // Create header element
        xnode.ParseXMLElement(&xml);
        enum XMLError error = xml.error;
        if(!xnode.nChildNode())
            error = eXMLErrorNoXMLTagFound;
        if((xnode.nChildNode() == 1) && (xnode.nElement() == 1))
            xnode = xnode.getChildNode();   // skip the empty node

        // If no error occurred
        if((error == eXMLErrorNone) || (error == eXMLErrorMissingEndTag)
           || (error == eXMLErrorNoXMLTagFound))
        {
            XMLCSTR name = xnode.getName();
            if(tag && (*tag) && ((!name) || (xstricmp(name, tag))))
            {
                xnode = xnode.getChildNode(tag);
                if(xnode.isEmpty())
                {
                    if(pResults)
                    {
                        pResults->error = eXMLErrorFirstTagNotFound;
                        pResults->nLine = 0;
                        pResults->nColumn = 0;
                    }
                    return emptyXMLNode;
                }
            }
        }
        else
        {
            // Cleanup: this will destroy all the nodes
            xnode = emptyXMLNode;
        }


        // If we have been given somewhere to place results
        if(pResults)
        {
            pResults->error = error;

            // If we have an error
            if(error != eXMLErrorNone)
            {
                if(error == eXMLErrorMissingEndTag)
                    xml.nIndex = xml.nIndexMissigEndTag;
                // Find which line and column it starts on.
                CountLinesAndColumns(xml.lpXML, xml.nIndex, pResults);
            }
        }
        return xnode;
    }